

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O1

void vector_insert(vector v,size_t position,void *element)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  size_t __n;
  ulong uVar5;
  void *__src;
  void *pvVar6;
  ulong uVar7;
  bool bVar8;
  
  if (v == (vector)0x0) {
    return;
  }
  if ((v->size == v->capacity) && (iVar2 = vector_reserve(v,v->capacity * 2), iVar2 != 0)) {
    log_write_impl_va("metacall",0x1a5,"vector_insert",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                      ,LOG_LEVEL_ERROR,"Vector reserve error");
  }
  __n = v->type_size;
  uVar4 = v->size;
  pvVar3 = v->data;
  if (uVar4 < position || uVar4 - position == 0) {
    if (pvVar3 == (void *)0x0) goto LAB_001196c9;
    uVar4 = uVar4 * __n;
    uVar5 = v->capacity * __n;
    pvVar3 = (void *)((long)pvVar3 + uVar4);
    bVar8 = uVar5 < uVar4;
    lVar1 = uVar5 - uVar4;
  }
  else {
    if (pvVar3 == (void *)0x0) {
      pvVar6 = (void *)0x0;
    }
    else {
      uVar5 = (position + 1) * __n;
      uVar7 = v->capacity * __n;
      pvVar6 = (void *)0x0;
      if (uVar5 <= uVar7 && uVar7 - uVar5 != 0) {
        pvVar6 = (void *)((long)pvVar3 + uVar5);
      }
    }
    if (pvVar3 == (void *)0x0) {
      __src = (void *)0x0;
    }
    else {
      uVar5 = __n * position;
      uVar7 = v->capacity * __n;
      __src = (void *)0x0;
      if (uVar5 <= uVar7 && uVar7 - uVar5 != 0) {
        __src = (void *)((long)pvVar3 + uVar5);
      }
    }
    memmove(pvVar6,__src,__n * (uVar4 - position));
    __n = v->type_size;
    if (v->data == (void *)0x0) {
LAB_001196c9:
      pvVar6 = (void *)0x0;
      goto LAB_001196cb;
    }
    uVar5 = position * __n;
    uVar4 = v->capacity * __n;
    pvVar3 = (void *)((long)v->data + uVar5);
    bVar8 = uVar4 < uVar5;
    lVar1 = uVar4 - uVar5;
  }
  pvVar6 = (void *)0x0;
  if (!bVar8 && lVar1 != 0) {
    pvVar6 = pvVar3;
  }
LAB_001196cb:
  memcpy(pvVar6,element,__n);
  v->size = v->size + 1;
  return;
}

Assistant:

void vector_insert(vector v, size_t position, void *element)
{
	if (v != NULL)
	{
		if (v->size == v->capacity)
		{
			if (vector_reserve(v, v->capacity * VECTOR_CAPACITY_INCREMENT) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Vector reserve error");
			}
		}

		if (position < v->size)
		{
			memmove(vector_data_offset_bytes(v, (position + 1) * v->type_size),
				vector_data_offset_bytes(v, position * v->type_size),
				(v->size - position) * v->type_size);

			memcpy(vector_data_offset_bytes(v, position * v->type_size), element, v->type_size);
		}
		else
		{
			memcpy(vector_data_offset_bytes(v, v->size * v->type_size), element, v->type_size);
		}

		++v->size;
	}
}